

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  uint uVar1;
  bool bVar2;
  uint j;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined7 extraout_var;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ostream *poVar11;
  undefined8 in_RCX;
  uint *puVar12;
  undefined4 uVar13;
  cmCommand *pcVar14;
  char cVar15;
  pointer pbVar16;
  uint uVar17;
  uint j_1;
  undefined4 uVar18;
  uint uVar20;
  bool bVar21;
  BOM local_558;
  int limit_output;
  cmCommand *local_550;
  uint local_548;
  BOM local_544;
  ulong local_540;
  uint local_534;
  uint local_530;
  uint local_52c;
  int limit_input;
  uint local_524;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  string s;
  ifstream fin;
  uint auStack_308 [122];
  string outVar;
  RegularExpression regex;
  undefined4 uVar19;
  
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x41) {
    std::__cxx11::string::string
              ((string *)&fin,"STRINGS requires a file name and output variable",(allocator *)&s);
    cmCommand::SetError(&this->super_cmCommand,(string *)&fin);
    std::__cxx11::string::~string((string *)&fin);
    return false;
  }
  std::__cxx11::string::string((string *)&fileName,(string *)(pbVar16 + 1));
  bVar2 = cmsys::SystemTools::FileIsFullPath(fileName._M_dataplus._M_p);
  if (!bVar2) {
    cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::assign((char *)&fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,"/",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::append((string *)&fileName);
    std::__cxx11::string::~string((string *)&fin);
  }
  local_550 = &this->super_cmCommand;
  std::__cxx11::string::string
            ((string *)&outVar,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  limit_input = -1;
  limit_output = -1;
  regex.program = (char *)0x0;
  local_544 = (BOM)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  local_524 = 0;
  local_530 = 0;
  local_52c = 0;
  local_548 = 0;
  local_534 = 0;
  local_558 = BOM_None;
  uVar13 = 0;
  for (uVar8 = 3; uVar1 = local_530, uVar17 = local_534, pcVar14 = local_550,
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16 >> 5);
      uVar8 = (ulong)((int)uVar8 + 1)) {
    bVar2 = std::operator==(pbVar16 + uVar8,"LIMIT_INPUT");
    if (bVar2) {
      uVar13 = 1;
      goto LAB_00359183;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"LIMIT_OUTPUT");
    if (bVar2) {
      uVar13 = 2;
      goto LAB_00359183;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"LIMIT_COUNT");
    if (bVar2) {
      uVar13 = 3;
      goto LAB_00359183;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"LENGTH_MINIMUM");
    if (bVar2) {
      uVar13 = 4;
      goto LAB_00359183;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"LENGTH_MAXIMUM");
    if (bVar2) {
      uVar13 = 5;
      goto LAB_00359183;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"REGEX");
    if (bVar2) {
      uVar13 = 7;
      goto LAB_00359183;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"NEWLINE_CONSUME");
    if (bVar2) {
      local_534 = (uint)CONCAT71(extraout_var,1);
      uVar13 = 0;
      goto LAB_00359183;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"NO_HEX_CONVERSION");
    uVar19 = 0;
    uVar18 = 0;
    if (bVar2) {
      local_544 = BOM_None;
      uVar13 = uVar19;
      goto LAB_00359183;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8,"ENCODING");
    if (bVar2) {
      uVar13 = 8;
      goto LAB_00359183;
    }
    puVar12 = &switchD_00359205::switchdataD_004af648;
    switch(uVar13) {
    case 1:
      iVar4 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p,
                              "%d",&limit_input);
      if ((iVar4 != 1) || (uVar13 = 0, limit_input < 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
        poVar11 = std::operator<<((ostream *)&fin,"STRINGS option LIMIT_INPUT value \"");
        pcVar14 = local_550;
        poVar11 = std::operator<<(poVar11,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar8));
        std::operator<<(poVar11,"\" is not an unsigned integer.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar14,&s);
        goto LAB_00359ec2;
      }
      break;
    case 2:
      iVar4 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p,
                              "%d",&limit_output);
      if ((iVar4 != 1) || (uVar13 = 0, limit_output < 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
        poVar11 = std::operator<<((ostream *)&fin,"STRINGS option LIMIT_OUTPUT value \"");
        pcVar14 = local_550;
        poVar11 = std::operator<<(poVar11,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar8));
        std::operator<<(poVar11,"\" is not an unsigned integer.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar14,&s);
        goto LAB_00359ec2;
      }
      break;
    case 3:
      iVar4 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p,
                              "%d",&output);
      if (iVar4 == 1) {
        local_52c = (uint)output._M_dataplus._M_p;
        uVar13 = uVar18;
        if (-1 < (int)(uint)output._M_dataplus._M_p) break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar11 = std::operator<<((ostream *)&fin,"STRINGS option LIMIT_COUNT value \"");
      pcVar14 = local_550;
      poVar11 = std::operator<<(poVar11,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar8));
      std::operator<<(poVar11,"\" is not an unsigned integer.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar14,&s);
      goto LAB_00359ec2;
    case 4:
      iVar4 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p,
                              "%d",&output);
      if (iVar4 == 1) {
        local_524 = (uint)output._M_dataplus._M_p;
        uVar13 = uVar18;
        if (-1 < (int)(uint)output._M_dataplus._M_p) break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar11 = std::operator<<((ostream *)&fin,"STRINGS option LENGTH_MINIMUM value \"");
      pcVar14 = local_550;
      poVar11 = std::operator<<(poVar11,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar8));
      std::operator<<(poVar11,"\" is not an unsigned integer.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar14,&s);
      goto LAB_00359ec2;
    case 5:
      iVar4 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p,
                              "%d",&output);
      if (iVar4 == 1) {
        local_530 = (uint)output._M_dataplus._M_p;
        uVar13 = uVar18;
        if (-1 < (int)(uint)output._M_dataplus._M_p) break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar11 = std::operator<<((ostream *)&fin,"STRINGS option LENGTH_MAXIMUM value \"");
      pcVar14 = local_550;
      poVar11 = std::operator<<(poVar11,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar8));
      std::operator<<(poVar11,"\" is not an unsigned integer.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar14,&s);
      goto LAB_00359ec2;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar11 = std::operator<<((ostream *)&fin,"STRINGS given unknown argument \"");
      pcVar14 = local_550;
      poVar11 = std::operator<<(poVar11,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar8));
      std::operator<<(poVar11,"\"");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(pcVar14,&s);
LAB_00359ec2:
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
      bVar2 = false;
      goto LAB_00359b94;
    case 7:
      bVar2 = cmsys::RegularExpression::compile
                        (&regex,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p);
      local_548 = (uint)CONCAT71((int7)((ulong)puVar12 >> 8),1);
      uVar13 = uVar18;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
        poVar11 = std::operator<<((ostream *)&fin,"STRINGS option REGEX value \"");
        pcVar14 = local_550;
        poVar11 = std::operator<<(poVar11,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + uVar8));
        std::operator<<(poVar11,"\" could not be compiled.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar14,&s);
        goto LAB_00359ec2;
      }
      break;
    case 8:
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar8,"UTF-8");
      if (bVar2) {
        local_558 = BOM_UTF8;
        uVar13 = uVar19;
      }
      else {
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar8,"UTF-16LE");
        if (bVar2) {
          local_558 = BOM_UTF16LE;
          uVar13 = uVar19;
        }
        else {
          bVar2 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar8,"UTF-16BE");
          if (bVar2) {
            local_558 = BOM_UTF16BE;
            uVar13 = uVar19;
          }
          else {
            bVar2 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar8,"UTF-32LE");
            if (bVar2) {
              local_558 = BOM_UTF32LE;
              uVar13 = uVar19;
            }
            else {
              bVar2 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar8,"UTF-32BE")
              ;
              local_558 = BOM_UTF32BE;
              uVar13 = uVar18;
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
                poVar11 = std::operator<<((ostream *)&fin,"STRINGS option ENCODING \"");
                poVar11 = std::operator<<(poVar11,(string *)
                                                  ((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar8
                                                  ));
                std::operator<<(poVar11,"\" not recognized.");
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(local_550,&s);
                goto LAB_00359ec2;
              }
            }
          }
        }
      }
    }
LAB_00359183:
  }
  if ((local_544 & BOM_UTF8) != BOM_None) {
    pcVar7 = cmMakefile::GetCurrentBinaryDirectory(local_550->Makefile);
    std::__cxx11::string::string((string *)&fin,pcVar7,(allocator *)&s);
    std::__cxx11::string::append((char *)&fin);
    std::__cxx11::string::append((char *)&fin);
    bVar2 = cmHexFileConverter::TryConvert(fileName._M_dataplus._M_p,_fin);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&fileName);
    }
    std::__cxx11::string::~string((string *)&fin);
  }
  std::ifstream::ifstream(&fin,fileName._M_dataplus._M_p,_S_in);
  bVar2 = (*(byte *)((long)auStack_308 + *(long *)(_fin + -0x18)) & 5) == 0;
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar11 = std::operator<<((ostream *)&s,"STRINGS file \"");
    poVar11 = std::operator<<(poVar11,(string *)&fileName);
    std::operator<<(poVar11,"\" cannot be read.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar14,&output);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    goto LAB_00359b87;
  }
  local_544 = cmsys::FStream::ReadBOM((istream *)&fin);
  if (local_544 == BOM_None) {
    local_544 = local_558;
  }
  if (local_558 != BOM_None) {
    local_544 = local_558;
  }
  uVar3 = 3;
  if ((local_544 & ~BOM_UTF8) != BOM_UTF32BE) {
    uVar3 = (uint)((local_544 & ~BOM_UTF8) == BOM_UTF16BE);
  }
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  uVar8 = (ulong)local_52c;
  uVar9 = (ulong)local_524;
  local_540 = 0;
  do {
    if ((local_52c != 0) &&
       (uVar10 = (long)strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5, uVar8 <= uVar10))
    goto LAB_00359a60;
    if (((-1 < limit_input) && (iVar4 = std::istream::tellg(), limit_input <= iVar4)) ||
       ((*(byte *)((long)auStack_308 + *(long *)(_fin + -0x18)) & 5) != 0)) break;
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    uVar5 = std::istream::get();
    uVar20 = uVar3;
    while( true ) {
      bVar21 = uVar20 == 0;
      uVar20 = uVar20 - 1;
      cVar15 = (char)&fin;
      if (bVar21) break;
      uVar6 = std::istream::get();
      if ((*(byte *)((long)auStack_308 + *(long *)(_fin + -0x18)) & 5) != 0) {
        std::istream::putback(cVar15);
        break;
      }
      uVar5 = uVar5 << 8 | uVar6;
    }
    if (local_544 == BOM_UTF32LE) {
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    else if (local_544 == BOM_UTF16LE) {
      uVar5 = (uint)(ushort)((ushort)uVar5 << 8 | (ushort)uVar5 >> 8);
    }
    if (uVar5 == 0xd) {
LAB_00359a24:
      bVar21 = false;
    }
    else {
      if ((byte)(uVar5 == 10 & (byte)uVar17 | (uVar5 == 9 || uVar5 - 0x20 < 0x5f)) == 1) {
        std::__cxx11::string::push_back((char)&output);
      }
      else if (local_544 == BOM_UTF8) {
        uVar20 = 0;
        for (uVar10 = 0; (uVar20 == 0 && (uVar10 < 3)); uVar10 = uVar10 + 1) {
          if ((HandleStringsCommand::utf8_check_table[uVar10][0] & uVar5) ==
              (uint)HandleStringsCommand::utf8_check_table[uVar10][1]) {
            uVar20 = (int)uVar10 + 2;
          }
          else {
            uVar20 = 0;
          }
        }
        for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
          if ((uVar17 != 0) &&
             ((uVar5 = std::istream::get(), (uVar5 & 0xc0) != 0x80 ||
              ((*(uint *)((long)auStack_308 + *(long *)(_fin + -0x18)) & 5) != 0)))) {
            std::istream::putback(cVar15);
            break;
          }
          std::__cxx11::string::push_back((char)&output);
        }
        uVar17 = local_534;
        if (output._M_string_length != uVar20) {
          for (uVar20 = 0; (ulong)uVar20 < output._M_string_length - 1; uVar20 = uVar20 + 1) {
            uVar5 = (uint)output._M_dataplus._M_p[~(ulong)uVar20 + output._M_string_length];
            std::istream::putback(cVar15);
          }
          std::__cxx11::string::assign((char *)&output);
        }
      }
      if (uVar5 == 10 && (uVar17 & 1) == 0) {
        if ((s._M_string_length < uVar9) ||
           (((local_548 & 1) != 0 &&
            (bVar21 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), !bVar21)))) {
LAB_0035994c:
          std::__cxx11::string::assign((char *)&s);
          goto LAB_00359980;
        }
        uVar5 = (int)local_540 + (int)s._M_string_length + 1;
        local_540 = (ulong)uVar5;
        if ((limit_output < 0) || ((int)uVar5 < limit_output)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&strings,&s);
          goto LAB_0035994c;
        }
        bVar21 = true;
        std::__cxx11::string::assign((char *)&s);
      }
      else {
        if (output._M_string_length == 0) {
          if ((s._M_string_length != 0 && uVar9 <= s._M_string_length) &&
             (((local_548 & 1) == 0 ||
              (bVar21 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar21)))) {
            uVar5 = (int)local_540 + (int)s._M_string_length + 1;
            local_540 = (ulong)uVar5;
            if ((-1 < limit_output) && (limit_output <= (int)uVar5)) {
              bVar21 = true;
              std::__cxx11::string::assign((char *)&s);
              goto LAB_00359a26;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&strings,&s);
          }
          std::__cxx11::string::assign((char *)&s);
        }
        else {
          std::__cxx11::string::append((string *)&s);
        }
LAB_00359980:
        bVar21 = false;
        if ((local_530 != 0) && (bVar21 = false, s._M_string_length == uVar1)) {
          if (local_524 <= local_530) {
            uVar5 = local_530;
            if ((local_548 & 1) != 0) {
              bVar21 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p);
              if (!bVar21) goto LAB_00359a14;
              uVar5 = (uint)s._M_string_length;
            }
            uVar5 = (int)local_540 + uVar5 + 1;
            local_540 = (ulong)uVar5;
            if ((-1 < limit_output) && (limit_output <= (int)uVar5)) {
              bVar21 = true;
              std::__cxx11::string::assign((char *)&s);
              goto LAB_00359a26;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&strings,&s);
          }
LAB_00359a14:
          std::__cxx11::string::assign((char *)&s);
          goto LAB_00359a24;
        }
      }
    }
LAB_00359a26:
    std::__cxx11::string::~string((string *)&output);
  } while (!bVar21);
  if (local_52c == 0) {
    iVar4 = (int)local_540;
LAB_00359a6f:
    pcVar14 = local_550;
    if ((((s._M_string_length != 0) && (uVar9 <= s._M_string_length)) &&
        (((local_548 & 1) == 0 ||
         (bVar21 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar21)))) &&
       ((limit_output < 0 || ((int)((uint)s._M_string_length + iVar4 + 1) < limit_output)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&strings,&s);
    }
  }
  else {
    uVar10 = (long)strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_00359a60:
    iVar4 = (int)local_540;
    pcVar14 = local_550;
    if (uVar10 < uVar8) goto LAB_00359a6f;
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  for (pbVar16 = strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar16 !=
      strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar16 = pbVar16 + 1) {
    std::__cxx11::string::append((char *)&output);
    for (uVar17 = 0; (ulong)uVar17 < pbVar16->_M_string_length; uVar17 = uVar17 + 1) {
      cVar15 = (char)&output;
      if ((pbVar16->_M_dataplus)._M_p[uVar17] == ';') {
        std::__cxx11::string::push_back(cVar15);
      }
      std::__cxx11::string::push_back(cVar15);
    }
  }
  cmMakefile::AddDefinition(pcVar14->Makefile,&outVar,output._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&s);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings);
LAB_00359b87:
  std::ifstream::~ifstream(&fin);
LAB_00359b94:
  cmsys::RegularExpression::~RegularExpression(&regex);
  std::__cxx11::string::~string((string *)&outVar);
  std::__cxx11::string::~string((string *)&fileName);
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if(args.size() < 3)
    {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
    }

  // Get the file to read.
  std::string fileName = args[1];
  if(!cmsys::SystemTools::FileIsFullPath(fileName.c_str()))
    {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
    }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum { arg_none,
         arg_limit_input,
         arg_limit_output,
         arg_limit_count,
         arg_length_minimum,
         arg_length_maximum,
         arg__maximum,
         arg_regex,
         arg_encoding };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum { encoding_none = cmsys::FStream::BOM_None,
         encoding_utf8 = cmsys::FStream::BOM_UTF8,
         encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
         encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
         encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
         encoding_utf32be = cmsys::FStream::BOM_UTF32BE};
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for(unsigned int i=3; i < args.size(); ++i)
    {
    if(args[i] == "LIMIT_INPUT")
      {
      arg_mode = arg_limit_input;
      }
    else if(args[i] == "LIMIT_OUTPUT")
      {
      arg_mode = arg_limit_output;
      }
    else if(args[i] == "LIMIT_COUNT")
      {
      arg_mode = arg_limit_count;
      }
    else if(args[i] == "LENGTH_MINIMUM")
      {
      arg_mode = arg_length_minimum;
      }
    else if(args[i] == "LENGTH_MAXIMUM")
      {
      arg_mode = arg_length_maximum;
      }
    else if(args[i] == "REGEX")
      {
      arg_mode = arg_regex;
      }
    else if(args[i] == "NEWLINE_CONSUME")
      {
      newline_consume = true;
      arg_mode = arg_none;
      }
    else if(args[i] == "NO_HEX_CONVERSION")
      {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
      }
    else if(args[i] == "ENCODING")
      {
      arg_mode = arg_encoding;
      }
    else if(arg_mode == arg_limit_input)
      {
      if(sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
         limit_input < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_limit_output)
      {
      if(sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
         limit_output < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_limit_count)
      {
      int count;
      if(sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      limit_count = count;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_length_minimum)
      {
      int len;
      if(sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      minlen = len;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_length_maximum)
      {
      int len;
      if(sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      maxlen = len;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_regex)
      {
      if(!regex.compile(args[i].c_str()))
        {
        std::ostringstream e;
        e << "STRINGS option REGEX value \""
          << args[i] << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
        }
      have_regex = true;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_encoding)
      {
      if(args[i] == "UTF-8")
        {
        encoding = encoding_utf8;
        }
      else if(args[i] == "UTF-16LE")
        {
        encoding = encoding_utf16le;
        }
      else if(args[i] == "UTF-16BE")
        {
        encoding = encoding_utf16be;
        }
      else if(args[i] == "UTF-32LE")
        {
        encoding = encoding_utf32le;
        }
      else if(args[i] == "UTF-32BE")
        {
        encoding = encoding_utf32be;
        }
      else
        {
        std::ostringstream e;
        e << "STRINGS option ENCODING \""
          << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else
      {
      std::ostringstream e;
      e << "STRINGS given unknown argument \""
        << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  if (hex_conversion_enabled)
    {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += cmake::GetCMakeFilesDirectory();
    binaryFileName += "/FileCommandStringsBinaryFile";
    if(cmHexFileConverter::TryConvert(fileName.c_str(),binaryFileName.c_str()))
      {
      fileName = binaryFileName;
      }
    }

  // Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str(), std::ios::in);
#endif
  if(!fin)
    {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
    }

  //If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if(encoding == encoding_none && bom_found != cmsys::FStream::BOM_None)
    {
    encoding = bom_found;
    }

  unsigned int bytes_rem = 0;
  if(encoding == encoding_utf16le || encoding == encoding_utf16be)
    {
    bytes_rem = 1;
    }
  if(encoding == encoding_utf32le || encoding == encoding_utf32be)
    {
    bytes_rem = 3;
    }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while((!limit_count || strings.size() < limit_count) &&
        (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
        fin)
    {
    std::string current_str;

    int c = fin.get();
    for(unsigned int i=0; i<bytes_rem; ++i)
      {
      int c1 = fin.get();
      if(!fin)
        {
        fin.putback(static_cast<char>(c1));
        break;
        }
      c = (c << 8) | c1;
      }
    if(encoding == encoding_utf16le)
      {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
      }
    else if(encoding == encoding_utf32le)
      {
       c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) |
          ((c & 0xFF0000) >> 8) | ((c & 0xFF000000) >> 24));
      }

    if(c == '\r')
      {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
      }

    else if((c >= 0x20 && c < 0x7F) || c == '\t' ||
            (c == '\n' && newline_consume))
      {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
      }
    else if(encoding == encoding_utf8)
      {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] =
        {
          {0xE0, 0xC0},
          {0xF0, 0xE0},
          {0xF8, 0xF0},
        };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for(unsigned int j=0; num_utf8_bytes == 0 && j<3; j++)
        {
        if((c & utf8_check_table[j][0]) == utf8_check_table[j][1])
          num_utf8_bytes = j+2;
        }

      // get subsequent octets and check that they are valid
      for(unsigned int j=0; j<num_utf8_bytes; j++)
        {
        if(j != 0)
          {
          c = fin.get();
          if(!fin || (c & 0xC0) != 0x80)
            {
            fin.putback(static_cast<char>(c));
            break;
            }
          }
        current_str += static_cast<char>(c);
        }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if((current_str.length() != num_utf8_bytes))
        {
        for(unsigned int j=0; j<current_str.size()-1; j++)
          {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
          }
        current_str = "";
        }
      }


    if(c == '\n' && !newline_consume)
      {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if(s.length() >= minlen &&
         (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }

      // Reset the string to empty.
      s = "";
      }
    else if(current_str.empty())
      {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if(s.length() >= minlen && !s.empty() &&
      (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }

      // Reset the string to empty.
      s = "";
      }
    else
      {
      s += current_str;
      }


    if(maxlen > 0 && s.size() == maxlen)
      {
      // Terminate a string if the maximum length is reached.
      if(s.length() >= minlen &&
         (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }
      s = "";
      }
    }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if((!limit_count || strings.size() < limit_count) &&
     !s.empty() && s.length() >= minlen &&
     (!have_regex || regex.find(s.c_str())))
    {
    output_size += static_cast<int>(s.size()) + 1;
    if(limit_output < 0 || output_size < limit_output)
      {
      strings.push_back(s);
      }
    }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for(std::vector<std::string>::const_iterator si = strings.begin();
      si != strings.end(); ++si)
    {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    std::string const& sr = *si;
    for(unsigned int i=0; i < sr.size(); ++i)
      {
      if(sr[i] == ';')
        {
        output += '\\';
        }
      output += sr[i];
      }
    }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}